

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O3

optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> * __thiscall
supermap::
SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void,_supermap::Key<4UL>_>
::find(optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>
       *__return_storage_ptr__,
      SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void,_supermap::Key<4UL>_>
      *this,Key<4UL> *pattern,
      function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
      *less,function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
            *equal)

{
  optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> *poVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Key<4UL> local_58 [2];
  undefined8 *local_50;
  function<bool_(const_supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_&,_const_supermap::Key<4UL>_&)>
  *local_48;
  Key<4UL> *local_40;
  optional<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_> *local_38;
  
  local_40 = pattern;
  iVar3 = (*(this->
            super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
            ).
            super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
            .
            super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
            ._vptr_OrderedStorage[1])(this);
  if (CONCAT44(extraout_var,iVar3) != 0) {
    local_48 = equal;
    local_38 = __return_storage_ptr__;
    iVar3 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              ._vptr_OrderedStorage[1])(this);
    if (CONCAT44(extraout_var_00,iVar3) < 2) {
      uVar9 = 0;
    }
    else {
      uVar5 = CONCAT44(extraout_var_00,iVar3);
      uVar8 = 0;
      do {
        uVar7 = uVar8 + uVar5 >> 1;
        (*(this->
          super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
          ).
          super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
          .
          super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
          ._vptr_OrderedStorage[4])(local_58,this,uVar7);
        if (*(long *)(less + 0x10) == 0) {
LAB_001649c4:
          std::__throw_bad_function_call();
        }
        cVar2 = (**(code **)(less + 0x18))(less,local_58,local_40);
        uVar6 = uVar5;
        uVar9 = uVar7;
        if (cVar2 == '\0') {
          if (*(long *)(local_48 + 0x10) == 0) goto LAB_001649c4;
          cVar2 = (**(code **)(local_48 + 0x18))(local_48,local_58,local_40);
          uVar6 = uVar7;
          uVar9 = uVar8;
          if (cVar2 != '\0') {
            uVar6 = uVar5;
            uVar9 = uVar7;
          }
        }
        if (local_50 != (undefined8 *)0x0) {
          operator_delete__(local_50);
        }
        uVar5 = uVar6;
        uVar8 = uVar9;
      } while (1 < uVar6 - uVar9);
    }
    iVar3 = (*(this->
              super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              ).
              super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              .
              super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
              ._vptr_OrderedStorage[1])(this);
    __return_storage_ptr__ = local_38;
    if (uVar9 < CONCAT44(extraout_var_01,iVar3)) {
      (*(this->
        super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        ).
        super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        .
        super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
        ._vptr_OrderedStorage[4])(local_58,this,uVar9);
      if (*(long *)(local_48 + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      cVar2 = (**(code **)(local_48 + 0x18))(local_48,local_58,local_40);
      poVar1 = local_38;
      if (cVar2 == '\0') {
        (local_38->
        super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_true,_false,_false>
        .
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>
        ._M_engaged = false;
        if (local_50 == (undefined8 *)0x0) {
          return local_38;
        }
      }
      else {
        (local_38->
        super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_true,_false,_false>
        .
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>
        ._M_payload._M_value.key.super_array<unsigned_char,_4UL> =
             local_58[0].super_array<unsigned_char,_4UL>._M_elems;
        puVar4 = (undefined8 *)operator_new__(10);
        *(undefined2 *)(puVar4 + 1) = 0;
        *puVar4 = 0;
        *(undefined8 **)
         ((long)&(poVar1->
                 super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>
                 ._M_payload + 8) = puVar4;
        *(undefined2 *)(puVar4 + 1) = *(undefined2 *)(local_50 + 1);
        *puVar4 = *local_50;
        (poVar1->
        super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_true,_false,_false>
        .
        super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>
        ._M_engaged = true;
      }
      operator_delete__(local_50);
      return poVar1;
    }
  }
  (__return_storage_ptr__->
  super__Optional_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_true,_false,_false>
  .super__Optional_payload_base<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>
  ._M_engaged = false;
  return __return_storage_ptr__;
}

Assistant:

std::optional<T> find(
        const FindPattern &pattern,
        std::function<bool(const T &, const FindPattern &)> less,
        std::function<bool(const T &, const FindPattern &)> equal
    ) override {
        if (getItemsCount() == 0) {
            return std::nullopt;
        }
        IndexT firstLeq = 0;
        IndexT lastGt = getItemsCount();
        while (lastGt - firstLeq > 1) {
            IndexT middle = (firstLeq + lastGt) / 2;
            T middleElem = get(middle);
            if (less(middleElem, pattern) || equal(middleElem, pattern)) {
                firstLeq = middle;
            } else {
                lastGt = middle;
            }
        }
        if (firstLeq >= getItemsCount()) {
            return std::nullopt;
        }
        T firstLeqElem = get(firstLeq);
        return equal(firstLeqElem, pattern) ? std::optional{firstLeqElem} : std::nullopt;
    }